

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void in1_r2(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  int reg;
  TCGv_i64 pTVar1;
  
  tcg_ctx = s->uc->tcg_ctx;
  reg = get_field1(s,FLD_O_r2,FLD_C_b2);
  pTVar1 = load_reg(tcg_ctx,reg);
  o->in1 = pTVar1;
  return;
}

Assistant:

static void in1_r2(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    o->in1 = load_reg(tcg_ctx, get_field(s, r2));
}